

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O0

int sys_open_absolute(char *name,char *ext,char *dirresult,char **nameresult,uint size,int bin,
                     int *fdp)

{
  int iVar1;
  char *pcVar2;
  int local_434;
  int dirlen;
  char *z;
  char dirbuf [1000];
  int bin_local;
  uint size_local;
  char **nameresult_local;
  char *dirresult_local;
  char *ext_local;
  char *name_local;
  
  iVar1 = sys_isabsolutepath(name);
  if (iVar1 == 0) {
    name_local._4_4_ = 0;
  }
  else {
    pcVar2 = strrchr(name,0x2f);
    if (pcVar2 == (char *)0x0) {
      name_local._4_4_ = 0;
    }
    else {
      local_434 = (int)pcVar2 - (int)name;
      if (999 < local_434) {
        local_434 = 999;
      }
      strncpy((char *)&z,name,(long)local_434);
      dirbuf[(long)local_434 + -8] = '\0';
      iVar1 = sys_trytoopenone((char *)&z,name + (local_434 + 1),ext,dirresult,nameresult,size,bin);
      *fdp = iVar1;
      name_local._4_4_ = 1;
    }
  }
  return name_local._4_4_;
}

Assistant:

int sys_open_absolute(const char *name, const char* ext,
    char *dirresult, char **nameresult, unsigned int size, int bin, int *fdp)
{
    if (sys_isabsolutepath(name))
    {
        char dirbuf[MAXPDSTRING], *z = strrchr(name, '/');
        int dirlen;
        if (!z)
            return (0);
        dirlen = (int)(z - name);
        if (dirlen > MAXPDSTRING-1)
            dirlen = MAXPDSTRING-1;
        strncpy(dirbuf, name, dirlen);
        dirbuf[dirlen] = 0;
        *fdp = sys_trytoopenone(dirbuf, name+(dirlen+1), ext,
            dirresult, nameresult, size, bin);
        return (1);
    }
    else return (0);
}